

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

void Rml::Parse::Term(DataParser *parser)

{
  char cVar1;
  Variant VStack_38;
  
  Factor(parser);
  if (parser->reached_end == false) {
    do {
      cVar1 = (parser->expression)._M_dataplus._M_p[parser->index];
      if (cVar1 == '/') {
        DataParser::Match(parser,'/',true);
        DataParser::Push(parser);
        Factor(parser);
        DataParser::Pop(parser,L);
        Variant::Variant(&VStack_38);
        DataParser::Emit(parser,Divide,&VStack_38);
      }
      else {
        if (cVar1 != '*') {
          return;
        }
        DataParser::Match(parser,'*',true);
        DataParser::Push(parser);
        Factor(parser);
        DataParser::Pop(parser,L);
        Variant::Variant(&VStack_38);
        DataParser::Emit(parser,Multiply,&VStack_38);
      }
      Variant::~Variant(&VStack_38);
    } while (parser->reached_end != true);
  }
  return;
}

Assistant:

static void Term(DataParser& parser)
	{
		Factor(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '*': Multiply(parser); break;
			case '/': Divide(parser); break;
			default: looping = false;
			}
		}
	}